

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

uint __thiscall Memory::LargeHeapBlock::GetMarkCount(LargeHeapBlock *this)

{
  Recycler *pRVar1;
  _func_int **pp_Var2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = this->allocCount;
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    pRVar1 = this->heapInfo->recycler;
    uVar5 = 0;
    uVar6 = 0;
    do {
      pp_Var2 = (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar5];
      if ((pp_Var2 != (_func_int **)0x0) && (uVar5 == *(uint *)pp_Var2)) {
        bVar3 = HeapBlockMap64::IsMarked(&pRVar1->heapBlockMap,pp_Var2 + 4);
        uVar6 = uVar6 + bVar3;
        uVar4 = this->allocCount;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return uVar6;
}

Assistant:

uint
LargeHeapBlock::GetMarkCount()
{
    uint markCount = 0;
    const HeapBlockMap& heapBlockMap = this->heapInfo->recycler->heapBlockMap;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader* header = this->HeaderList()[i];
        if (header && header->objectIndex == i && heapBlockMap.IsMarked(header->GetAddress()))
        {
            markCount++;
        }
    }

    return markCount;
}